

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_util.cpp
# Opt level: O1

bool Kumu::read_BER(byte_t *buf,ui64_t *val)

{
  byte bVar1;
  long lVar2;
  byte *pbVar3;
  
  if ((val != (ui64_t *)0x0 && buf != (byte_t *)0x0) && ((char)*buf < '\0')) {
    *val = 0;
    bVar1 = (byte)(*buf & 0xf);
    if (bVar1 < 9) {
      if (bVar1 == 0) {
        return true;
      }
      pbVar3 = buf + 1;
      lVar2 = (ulong)(*buf & 0xf) * 8 + -8;
      do {
        if ((ulong)*pbVar3 != 0) {
          *val = *val | (ulong)*pbVar3 << ((byte)lVar2 & 0x3f);
        }
        pbVar3 = pbVar3 + 1;
        lVar2 = lVar2 + -8;
      } while (lVar2 != -8);
      return true;
    }
  }
  return false;
}

Assistant:

bool
Kumu::read_BER(const byte_t* buf, ui64_t* val)
{
  ui8_t ber_size, i;
  
  if ( buf == 0 || val == 0 )
    return false;

  if ( ( *buf & 0x80 ) == 0 )
    return false;

  *val = 0;
  ber_size = ( *buf & 0x0f ) + 1;

  if ( ber_size > 9 )
    return false;

  for ( i = 1; i < ber_size; i++ )
    {
      if ( buf[i] > 0 )
	*val |= (ui64_t)buf[i] << ( ( ( ber_size - 1 ) - i ) * 8 );
    }

  return true;
}